

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O2

void QueryHandler2(string *query)

{
  LogText *pLVar1;
  ostream *poVar2;
  _List_node_base *p_Var3;
  long in_FS_OFFSET;
  LogText logger;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  LogText local_60;
  
  local_60.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60.lines_;
  local_60.super_ThreadCapture<LogText>._vptr_ThreadCapture = (_func_int **)&PTR__LogText_00104d80;
  local_60.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_60.type_ = kNew;
  local_60.capture_to_.previous_ = *(LogText **)(in_FS_OFFSET + -8);
  local_60.capture_to_.current_ = &local_60;
  *(LogText **)(in_FS_OFFSET + -8) = local_60.capture_to_.current_;
  local_60.lines_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_60.lines_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::operator+(&local_80,"QueryHandler2 called: ",query);
  LogText::Log(&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator+(&local_a0,query,"!!!");
  QueryHandler1(&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  pLVar1 = LogText::Delegate(&local_60);
  p_Var3 = (_List_node_base *)&pLVar1->lines_;
  while (p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&pLVar1->lines_) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Available from QueryHandler2: \"");
    poVar2 = std::operator<<(poVar2,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  LogText::~LogText(&local_60);
  return;
}

Assistant:

void QueryHandler2(const std::string& query) {
  LogText logger(LogText::InheritType::kNew);
  LogText::Log("QueryHandler2 called: " + query);
  QueryHandler1(query + "!!!");
  for (const auto& line : logger.GetLines()) {
    std::cerr << "Available from QueryHandler2: \"" << line << "\""
              << std::endl;
  }
}